

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::TreeEnsembleParameters_TreeNode::MergeFrom
          (TreeEnsembleParameters_TreeNode *this,TreeEnsembleParameters_TreeNode *from)

{
  ulong uVar1;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O3/mlmodel/format/TreeEnsemble.pb.cc"
               ,0x330);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo>::TypeHandler>
            (&(this->evaluationinfo_).super_RepeatedPtrFieldBase,
             &(from->evaluationinfo_).super_RepeatedPtrFieldBase);
  if (from->treeid_ != 0) {
    this->treeid_ = from->treeid_;
  }
  if (from->nodeid_ != 0) {
    this->nodeid_ = from->nodeid_;
  }
  if (from->nodebehavior_ != 0) {
    this->nodebehavior_ = from->nodebehavior_;
  }
  if (from->missingvaluetrackstruechild_ == true) {
    this->missingvaluetrackstruechild_ = true;
  }
  if (from->branchfeatureindex_ != 0) {
    this->branchfeatureindex_ = from->branchfeatureindex_;
  }
  if (from->branchfeaturevalue_ != 0.0) {
    this->branchfeaturevalue_ = from->branchfeaturevalue_;
  }
  if (from->truechildnodeid_ != 0) {
    this->truechildnodeid_ = from->truechildnodeid_;
  }
  if (from->falsechildnodeid_ != 0) {
    this->falsechildnodeid_ = from->falsechildnodeid_;
  }
  if (from->relativehitrate_ != 0.0) {
    this->relativehitrate_ = from->relativehitrate_;
  }
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

void TreeEnsembleParameters_TreeNode::MergeFrom(const TreeEnsembleParameters_TreeNode& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.TreeEnsembleParameters.TreeNode)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  evaluationinfo_.MergeFrom(from.evaluationinfo_);
  if (from._internal_treeid() != 0) {
    _internal_set_treeid(from._internal_treeid());
  }
  if (from._internal_nodeid() != 0) {
    _internal_set_nodeid(from._internal_nodeid());
  }
  if (from._internal_nodebehavior() != 0) {
    _internal_set_nodebehavior(from._internal_nodebehavior());
  }
  if (from._internal_missingvaluetrackstruechild() != 0) {
    _internal_set_missingvaluetrackstruechild(from._internal_missingvaluetrackstruechild());
  }
  if (from._internal_branchfeatureindex() != 0) {
    _internal_set_branchfeatureindex(from._internal_branchfeatureindex());
  }
  static_assert(sizeof(uint64_t) == sizeof(double), "Code assumes uint64_t and double are the same size.");
  double tmp_branchfeaturevalue = from._internal_branchfeaturevalue();
  uint64_t raw_branchfeaturevalue;
  memcpy(&raw_branchfeaturevalue, &tmp_branchfeaturevalue, sizeof(tmp_branchfeaturevalue));
  if (raw_branchfeaturevalue != 0) {
    _internal_set_branchfeaturevalue(from._internal_branchfeaturevalue());
  }
  if (from._internal_truechildnodeid() != 0) {
    _internal_set_truechildnodeid(from._internal_truechildnodeid());
  }
  if (from._internal_falsechildnodeid() != 0) {
    _internal_set_falsechildnodeid(from._internal_falsechildnodeid());
  }
  static_assert(sizeof(uint64_t) == sizeof(double), "Code assumes uint64_t and double are the same size.");
  double tmp_relativehitrate = from._internal_relativehitrate();
  uint64_t raw_relativehitrate;
  memcpy(&raw_relativehitrate, &tmp_relativehitrate, sizeof(tmp_relativehitrate));
  if (raw_relativehitrate != 0) {
    _internal_set_relativehitrate(from._internal_relativehitrate());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}